

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O1

void __thiscall
absl::lts_20240722::strings_internal::
SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
::SplitIterator(SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *this,State state,
               Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
               *splitter)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *extraout_RDX;
  SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *unaff_RBX;
  char *pcVar4;
  char *pcVar5;
  ulong unaff_R14;
  char *unaff_R15;
  undefined1 auVar6 [16];
  
  pcVar4 = (char *)(ulong)state;
  while( true ) {
    this->pos_ = 0;
    this->state_ = (State)pcVar4;
    (this->curr_)._M_len = 0;
    (this->curr_)._M_str = (char *)0x0;
    this->splitter_ = splitter;
    (this->delimiter_).c_ = (splitter->delimiter_).c_;
    sVar2 = (splitter->text_)._M_len;
    if ((splitter->text_)._M_str == (char *)0x0) break;
    if ((State)pcVar4 == kEndState) goto LAB_00177aea;
    *(char **)((long)register0x00000020 + -8) = unaff_R15;
    *(ulong *)((long)register0x00000020 + -0x10) = unaff_R14;
    *(SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      **)((long)register0x00000020 + -0x18) = unaff_RBX;
    if (this->state_ == kLastState) {
      this->state_ = kEndState;
      return;
    }
    sVar2 = this->pos_;
    unaff_R14 = (this->splitter_->text_)._M_len;
    unaff_R15 = (this->splitter_->text_)._M_str;
    *(undefined8 *)((long)register0x00000020 + -0x20) = 0x177a5e;
    auVar6 = absl::lts_20240722::ByChar::Find(&this->delimiter_,unaff_R14,unaff_R15,sVar2);
    if (auVar6._8_8_ == unaff_R15 + unaff_R14) {
      this->state_ = kLastState;
    }
    uVar1 = this->pos_;
    if (uVar1 <= unaff_R14) {
      uVar3 = (long)auVar6._8_8_ - (long)(unaff_R15 + uVar1);
      if (unaff_R14 - uVar1 < uVar3) {
        uVar3 = unaff_R14 - uVar1;
      }
      (this->curr_)._M_len = uVar3;
      (this->curr_)._M_str = unaff_R15 + uVar1;
      this->pos_ = auVar6._0_8_ + uVar1 + uVar3;
      return;
    }
    pcVar5 = "%s: __pos (which is %zu) > __size (which is %zu)";
    pcVar4 = "basic_string_view::substr";
    *(undefined8 *)((long)register0x00000020 + -0x20) = 0x177abb;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar1,
               unaff_R14);
    splitter = extraout_RDX;
    unaff_RBX = this;
    register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x18);
    this = (SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)pcVar5;
  }
  this->state_ = kEndState;
LAB_00177aea:
  this->pos_ = sVar2;
  return;
}

Assistant:

SplitIterator(State state, const Splitter* splitter)
      : pos_(0),
        state_(state),
        splitter_(splitter),
        delimiter_(splitter->delimiter()),
        predicate_(splitter->predicate()) {
    // Hack to maintain backward compatibility. This one block makes it so an
    // empty absl::string_view whose .data() happens to be nullptr behaves
    // *differently* from an otherwise empty absl::string_view whose .data() is
    // not nullptr. This is an undesirable difference in general, but this
    // behavior is maintained to avoid breaking existing code that happens to
    // depend on this old behavior/bug. Perhaps it will be fixed one day. The
    // difference in behavior is as follows:
    //   Split(absl::string_view(""), '-');  // {""}
    //   Split(absl::string_view(), '-');    // {}
    if (splitter_->text().data() == nullptr) {
      state_ = kEndState;
      pos_ = splitter_->text().size();
      return;
    }

    if (state_ == kEndState) {
      pos_ = splitter_->text().size();
    } else {
      ++(*this);
    }
  }